

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_nes_video(nes_video_output *video,void *client)

{
  int local_128;
  int local_124;
  int x;
  int y;
  nes_pixel *pixel;
  uint32_t colors [64];
  void *client_local;
  nes_video_output *video_local;
  
  colors._248_8_ = client;
  memcpy(&pixel,&DAT_0010f150,0x100);
  _x = video->framebuffer;
  for (local_124 = 0; local_124 < (int)(uint)video->height; local_124 = local_124 + 1) {
    for (local_128 = 0; local_128 < (int)(uint)video->width; local_128 = local_128 + 1) {
      texture_buffer[local_124 * 0x100 + local_128] =
           colors[(ulong)_x[local_128].value - 2] | 0xff000000;
    }
    _x = _x + 0x155;
  }
  SDL_UpdateTexture(texture,0,texture_buffer,0x400);
  video_srcrect.w = (uint)video->width;
  video_srcrect.h = (uint)video->height;
  return;
}

Assistant:

void on_nes_video(const nes_video_output* video, void* client)
{
    const uint32_t colors[] = {
    0x545454, 0x741E00, 0x901008, 0x880030, 0x640044, 0x30005C, 0x000454, 0x00183C, 0x002A20, 0x003A08, 0x004000, 0x003C00, 0x3C3200, 0x000000, 0, 0,
    0x989698, 0xC44C08, 0xEC3230, 0xE41E5C, 0xB01488, 0x6414A0, 0x202298, 0x003C78, 0x005A54, 0x007228, 0x007C08, 0x287600, 0x786600, 0x000000, 0, 0,
    0xECEEEC, 0xEC9A4C, 0xEC7C78, 0xEC62B0, 0xEC54E4, 0xB458EC, 0x646AEC, 0x2088D4, 0x00AAA0, 0x00C474, 0x20D04C, 0x6CCC38, 0xCCB438, 0x3C3C3C, 0, 0, 
    0xECEEEC, 0xECCCA8, 0xECBCBC, 0xECB2D4, 0xECAEEC, 0xD4AEEC, 0xB0B4EC, 0x90C4E4, 0x78D2CC, 0x78DEB4, 0x90E2A8, 0xB4E298, 0xE4D6A0, 0xA0A2A0, 0, 0};
 
    nes_pixel* pixel = video->framebuffer;
    for (int y = 0; y < video->height; ++y)
    {
        for (int x = 0; x < video->width; ++x)
        {
            texture_buffer[y * 256 + x] = colors[(pixel + x)->value] | 0xFF000000;
        }
        pixel += NES_FRAMEBUFFER_ROW_STRIDE;
    }

    SDL_UpdateTexture(texture, 0, texture_buffer, sizeof(uint32_t) * TEXTURE_WIDTH);
    video_srcrect.w = video->width;
    video_srcrect.h = video->height;
}